

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O2

void __thiscall
btQuantizedBvh::updateSubtreeHeaders
          (btQuantizedBvh *this,int leftChildNodexIndex,int rightChildNodexIndex)

{
  btQuantizedBvhNode *pbVar1;
  btBvhSubtreeInfo *pbVar2;
  uint uVar3;
  uint uVar4;
  btBvhSubtreeInfo local_50;
  
  pbVar1 = (this->m_quantizedContiguousNodes).m_data;
  uVar3 = -pbVar1[leftChildNodexIndex].m_escapeIndexOrTriangleIndex;
  if (-1 < pbVar1[leftChildNodexIndex].m_escapeIndexOrTriangleIndex) {
    uVar3 = 1;
  }
  uVar4 = -pbVar1[rightChildNodexIndex].m_escapeIndexOrTriangleIndex;
  if (-1 < pbVar1[rightChildNodexIndex].m_escapeIndexOrTriangleIndex) {
    uVar4 = 1;
  }
  if (uVar3 < 0x81) {
    pbVar2 = btAlignedObjectArray<btBvhSubtreeInfo>::expand(&this->m_SubtreeHeaders,&local_50);
    btBvhSubtreeInfo::setAabbFromQuantizeNode(pbVar2,pbVar1 + leftChildNodexIndex);
    pbVar2->m_rootNodeIndex = leftChildNodexIndex;
    pbVar2->m_subtreeSize = uVar3;
  }
  if (uVar4 < 0x81) {
    pbVar2 = btAlignedObjectArray<btBvhSubtreeInfo>::expand(&this->m_SubtreeHeaders,&local_50);
    btBvhSubtreeInfo::setAabbFromQuantizeNode(pbVar2,pbVar1 + rightChildNodexIndex);
    pbVar2->m_rootNodeIndex = rightChildNodexIndex;
    pbVar2->m_subtreeSize = uVar4;
  }
  this->m_subtreeHeaderCount = (this->m_SubtreeHeaders).m_size;
  return;
}

Assistant:

void	btQuantizedBvh::updateSubtreeHeaders(int leftChildNodexIndex,int rightChildNodexIndex)
{
	btAssert(m_useQuantization);

	btQuantizedBvhNode& leftChildNode = m_quantizedContiguousNodes[leftChildNodexIndex];
	int leftSubTreeSize = leftChildNode.isLeafNode() ? 1 : leftChildNode.getEscapeIndex();
	int leftSubTreeSizeInBytes =  leftSubTreeSize * static_cast<int>(sizeof(btQuantizedBvhNode));
	
	btQuantizedBvhNode& rightChildNode = m_quantizedContiguousNodes[rightChildNodexIndex];
	int rightSubTreeSize = rightChildNode.isLeafNode() ? 1 : rightChildNode.getEscapeIndex();
	int rightSubTreeSizeInBytes =  rightSubTreeSize *  static_cast<int>(sizeof(btQuantizedBvhNode));

	if(leftSubTreeSizeInBytes <= MAX_SUBTREE_SIZE_IN_BYTES)
	{
		btBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(leftChildNode);
		subtree.m_rootNodeIndex = leftChildNodexIndex;
		subtree.m_subtreeSize = leftSubTreeSize;
	}

	if(rightSubTreeSizeInBytes <= MAX_SUBTREE_SIZE_IN_BYTES)
	{
		btBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(rightChildNode);
		subtree.m_rootNodeIndex = rightChildNodexIndex;
		subtree.m_subtreeSize = rightSubTreeSize;
	}

	//PCK: update the copy of the size
	m_subtreeHeaderCount = m_SubtreeHeaders.size();
}